

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O3

ai_real Assimp::ComputePositionEpsilon(aiMesh **pMeshes,size_t num)

{
  float fVar1;
  ulong uVar2;
  aiVector3D *paVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  float fVar19;
  float fVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  float fVar23;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  float fVar26;
  
  if (pMeshes != (aiMesh **)0x0) {
    if (num == 0) {
      fVar19 = -2e+10;
      uVar24 = 0x501502f9501502f9;
      uVar21 = 0xd01502f9d01502f9;
    }
    else {
      uVar11 = (undefined4)DAT_001ef820;
      uVar12 = DAT_001ef820._4_4_;
      uVar13 = DAT_001ef820._8_4_;
      uVar14 = DAT_001ef820._12_4_;
      uVar15 = (undefined4)DAT_001ef830;
      uVar16 = DAT_001ef830._4_4_;
      uVar17 = DAT_001ef830._8_4_;
      uVar18 = DAT_001ef830._12_4_;
      sVar8 = 0;
      fVar23 = 1e+10;
      fVar20 = -1e+10;
      do {
        uVar9 = (ulong)pMeshes[sVar8]->mNumVertices;
        fVar26 = 1e+10;
        fVar19 = -1e+10;
        auVar22 = _DAT_001ef820;
        auVar25 = _DAT_001ef830;
        if (uVar9 != 0) {
          paVar3 = pMeshes[sVar8]->mVertices;
          lVar10 = 0;
          fVar26 = 1e+10;
          fVar19 = -1e+10;
          do {
            fVar1 = *(float *)((long)&paVar3->z + lVar10);
            if (fVar1 <= fVar26) {
              fVar26 = fVar1;
            }
            uVar2 = *(ulong *)((long)&paVar3->x + lVar10);
            auVar6._8_8_ = 0;
            auVar6._0_8_ = uVar2;
            auVar25 = minps(auVar25,auVar6);
            auVar7._8_8_ = 0;
            auVar7._0_8_ = uVar2;
            auVar22 = maxps(auVar22,auVar7);
            if (fVar19 <= fVar1) {
              fVar19 = fVar1;
            }
            lVar10 = lVar10 + 0xc;
          } while (uVar9 * 0xc != lVar10);
        }
        if (fVar19 <= fVar20) {
          fVar19 = fVar20;
        }
        auVar5._4_4_ = uVar12;
        auVar5._0_4_ = uVar11;
        auVar5._8_4_ = uVar13;
        auVar5._12_4_ = uVar14;
        auVar22 = maxps(auVar22,auVar5);
        uVar21 = auVar22._0_8_;
        if (fVar23 <= fVar26) {
          fVar26 = fVar23;
        }
        fVar23 = fVar26;
        auVar4._4_4_ = uVar16;
        auVar4._0_4_ = uVar15;
        auVar4._8_4_ = uVar17;
        auVar4._12_4_ = uVar18;
        auVar25 = minps(auVar25,auVar4);
        uVar24 = auVar25._0_8_;
        sVar8 = sVar8 + 1;
        uVar15 = auVar25._0_4_;
        uVar16 = auVar25._4_4_;
        uVar17 = auVar25._8_4_;
        uVar18 = auVar25._12_4_;
        uVar11 = auVar22._0_4_;
        uVar12 = auVar22._4_4_;
        uVar13 = auVar22._8_4_;
        uVar14 = auVar22._12_4_;
        fVar20 = fVar19;
      } while (sVar8 != num);
      fVar19 = fVar19 - fVar23;
    }
    fVar20 = (float)uVar21 - (float)uVar24;
    fVar23 = (float)((ulong)uVar21 >> 0x20) - (float)((ulong)uVar24 >> 0x20);
    return SQRT(fVar19 * fVar19 + fVar20 * fVar20 + fVar23 * fVar23) * 0.0001;
  }
  __assert_fail("__null != pMeshes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/ProcessHelper.cpp"
                ,0xa0,"ai_real Assimp::ComputePositionEpsilon(const aiMesh *const *, size_t)");
}

Assistant:

ai_real ComputePositionEpsilon(const aiMesh* const* pMeshes, size_t num)
{
    ai_assert( NULL != pMeshes );

    const ai_real epsilon = ai_real( 1e-4 );

    // calculate the position bounds so we have a reliable epsilon to check position differences against
    aiVector3D minVec, maxVec, mi, ma;
    MinMaxChooser<aiVector3D>()(minVec,maxVec);

    for (size_t a = 0; a < num; ++a) {
        const aiMesh* pMesh = pMeshes[a];
        ArrayBounds(pMesh->mVertices,pMesh->mNumVertices,mi,ma);

        minVec = std::min(minVec,mi);
        maxVec = std::max(maxVec,ma);
    }
    return (maxVec - minVec).Length() * epsilon;
}